

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O0

int BeliefValue::GetMaximizingVectorIndex(BeliefInterface *b,VectorSet *v)

{
  size_type sVar1;
  reference pvVar2;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RSI;
  long *in_RDI;
  int k;
  vector<double,_std::allocator<double>_> Vb;
  double maxVal;
  int maximizingVectorI;
  int nrInV;
  int local_3c;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  double local_20;
  int local_18;
  
  sVar1 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size1(in_RSI);
  local_18 = 0;
  (**(code **)(*in_RDI + 0x88))(local_38,in_RDI,in_RSI);
  local_20 = -1.79769313486232e+308;
  for (local_3c = 0; local_3c != (int)sVar1; local_3c = local_3c + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,(long)local_3c);
    if (local_20 < *pvVar2) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_38,(long)local_3c);
      local_20 = *pvVar2;
      local_18 = local_3c;
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffd0);
  return local_18;
}

Assistant:

int
BeliefValue::GetMaximizingVectorIndex(const BeliefInterface &b, 
                                      const VectorSet &v)
{
    int nrInV=v.size1();
    int maximizingVectorI=0;
    double maxVal;

    // compute value of b for every vector in VS
    vector<double> Vb=b.InnerProduct(v);

    // find maximizing vector, ignores effects of duplicate values
    maxVal=-DBL_MAX;
    for(int k=0;k!=nrInV;k++)
    {
        if(Vb[k]>maxVal)
        {
            maxVal=Vb[k];
            maximizingVectorI=k;
        }
    }

    return(maximizingVectorI);
}